

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O1

void embree::initializeClothPositions(ClothModel *cloth)

{
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *__x;
  pointer __s;
  pointer pVVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (DAT_002d4d50 != sim_collisions) {
    DAT_002d4d50 = sim_collisions;
  }
  if (NX != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (NZ != 0) {
        lVar4 = 4;
        uVar5 = 0;
        do {
          *(float *)((long)(cloth->x_0_).
                           super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar4 + -4 + NX * lVar2) =
               (5.0 / (float)(NX - 1)) * (float)uVar3 + -2.5;
          *(undefined4 *)
           ((long)&((cloth->x_0_).
                    super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
                    super__Vector_impl_data._M_start)->field_0 + lVar4 + NX * lVar2) = 0x3fc00000;
          *(float *)((long)&((cloth->x_0_).
                             super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
                             _M_impl.super__Vector_impl_data._M_start)->field_0 +
                    lVar4 + 4 + NX * lVar2) = (float)uVar5 * (5.0 / (float)(NZ - 1)) + -2.5;
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (uVar5 < NZ);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < NX);
  }
  __x = &cloth->x_0_;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=
            (&(cloth->super_Mesh).x_,__x);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=(&cloth->x_old_,__x);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=(&cloth->x_last_,__x);
  __s = (cloth->v_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
        super__Vector_impl_data._M_start;
  pVVar1 = (cloth->v_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pVVar1) {
    memset(__s,0,((long)pVVar1 + (-0x10 - (long)__s) & 0xfffffffffffffff0U) + 0x10);
  }
  cur_time = 0;
  collide2::ClothModel::clearCollisionConstraints(cloth);
  return;
}

Assistant:

void initializeClothPositions (collide2::ClothModel & cloth) {

  sim_collisions.clear();

  for (size_t i=0; i<NX; ++i) {
    for (size_t j=0; j<NZ; ++j) {
      cloth.x_0_[NX*i+j].x = -(.5f*width) + (float)i*(width/(float)(NX-1));
      cloth.x_0_[NX*i+j].y = +1.5f;
      cloth.x_0_[NX*i+j].z = -(.5f*height) + (float)j*(height/(float)(NZ-1));
    }
  }
  cloth.x_ = cloth.x_0_;
  cloth.x_old_ = cloth.x_0_;
  cloth.x_last_ = cloth.x_0_;
  collide2::vec_t nullvec(0.f, 0.f, 0.f);
  std::fill (cloth.v_.begin (), cloth.v_.end (), nullvec);

  cur_time = 0;
  cloth.clearCollisionConstraints();
}